

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *glEffect,uint pass)

{
  uint uVar1;
  uint uVar2;
  MOJOSHADER_glProgram *pMVar3;
  MOJOSHADER_effect *pMVar4;
  MOJOSHADER_effectPass *pMVar5;
  MOJOSHADER_effectState *pMVar6;
  MOJOSHADER_effectStateChanges *pMVar7;
  MOJOSHADER_glShader *pMVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  MOJOSHADER_effectObject *pMVar13;
  MOJOSHADER_effectObject *pMVar14;
  
  pMVar3 = ctx->bound_program;
  if (pMVar3 != (MOJOSHADER_glProgram *)0x0) {
    pMVar8 = pMVar3->fragment;
    glEffect->current_vert = pMVar3->vertex;
    glEffect->current_frag = pMVar8;
  }
  pMVar4 = glEffect->effect;
  if (pMVar4->current_pass != -1) {
    __assert_fail("glEffect->effect->current_pass == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0xae3,"void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *, unsigned int)");
  }
  pMVar14 = (MOJOSHADER_effectObject *)glEffect->current_vert_raw;
  pMVar13 = (MOJOSHADER_effectObject *)glEffect->current_frag_raw;
  pMVar4->current_pass = pass;
  pMVar5 = pMVar4->current_technique->passes;
  uVar1 = pMVar5[pass].state_count;
  pMVar6 = pMVar5[pass].states;
  uVar10 = 0;
  bVar9 = false;
  do {
    if (uVar10 == uVar1) {
      pMVar7 = pMVar4->state_changes;
      pMVar7->render_state_changes = pMVar6;
      pMVar7->render_state_change_count = uVar1;
      glEffect->current_vert_raw = (MOJOSHADER_effectShader *)pMVar14;
      glEffect->current_frag_raw = (MOJOSHADER_effectShader *)pMVar13;
      if (!bVar9) {
        MOJOSHADER_glBindShaders(glEffect->current_vert,glEffect->current_frag);
        if (glEffect->current_vert_raw != (MOJOSHADER_effectShader *)0x0) {
          pMVar7 = glEffect->effect->state_changes;
          pMVar7->vertex_sampler_state_changes =
               *(MOJOSHADER_samplerStateRegister **)((long)pMVar14 + 0x38);
          pMVar7->vertex_sampler_state_change_count = *(uint *)((long)pMVar14 + 0x30);
        }
        if (glEffect->current_frag_raw != (MOJOSHADER_effectShader *)0x0) {
          pMVar7 = glEffect->effect->state_changes;
          pMVar7->sampler_state_changes =
               *(MOJOSHADER_samplerStateRegister **)((long)pMVar13 + 0x38);
          pMVar7->sampler_state_change_count = *(uint *)((long)pMVar13 + 0x30);
        }
      }
      MOJOSHADER_glEffectCommitChanges(glEffect);
      return;
    }
    if (pMVar6[uVar10].type == MOJOSHADER_RS_VERTEXSHADER) {
      uVar2 = *pMVar6[uVar10].value.field_4.valuesI;
      lVar11 = 0;
      uVar12 = 0;
      do {
        if (uVar2 == glEffect->shader_indices[uVar12]) {
          pMVar14 = pMVar4->objects + (int)uVar2;
          glEffect->current_vert =
               (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar11);
          break;
        }
        if ((glEffect->num_preshaders != 0) && (uVar2 == glEffect->preshader_indices[uVar12])) {
          pMVar14 = pMVar4->objects + (int)uVar2;
          goto LAB_0010c5c8;
        }
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar12 < glEffect->num_shaders);
    }
    else if (pMVar6[uVar10].type == MOJOSHADER_RS_PIXELSHADER) {
      uVar2 = *pMVar6[uVar10].value.field_4.valuesI;
      lVar11 = 0;
      uVar12 = 0;
LAB_0010c52f:
      if (uVar2 == glEffect->shader_indices[uVar12]) {
        pMVar13 = pMVar4->objects + (int)uVar2;
        glEffect->current_frag =
             (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar11);
      }
      else {
        if ((glEffect->num_preshaders == 0) || (uVar2 != glEffect->preshader_indices[uVar12]))
        break;
        pMVar13 = pMVar4->objects + (int)uVar2;
LAB_0010c5c8:
        bVar9 = true;
      }
    }
LAB_0010c5cb:
    uVar10 = uVar10 + 1;
  } while( true );
  uVar12 = uVar12 + 1;
  lVar11 = lVar11 + 0x10;
  if (glEffect->num_shaders <= uVar12) goto LAB_0010c5cb;
  goto LAB_0010c52f;
}

Assistant:

void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *glEffect,
                                  unsigned int pass)
{
    int i, j;
    MOJOSHADER_effectPass *curPass;
    MOJOSHADER_effectState *state;
    MOJOSHADER_effectShader *rawVert = glEffect->current_vert_raw;
    MOJOSHADER_effectShader *rawFrag = glEffect->current_frag_raw;
    int has_preshader = 0;

    if (ctx->bound_program != NULL)
    {
        glEffect->current_vert = ctx->bound_program->vertex;
        glEffect->current_frag = ctx->bound_program->fragment;
    } // if

    assert(glEffect->effect->current_pass == -1);
    glEffect->effect->current_pass = pass;
    curPass = &glEffect->effect->current_technique->passes[pass];

    // !!! FIXME: I bet this could be stored at parse/compile time. -flibit
    for (i = 0; i < curPass->state_count; i++)
    {
        state = &curPass->states[i];
        #define ASSIGN_SHADER(stype, raw, gls) \
            (state->type == stype) \
            { \
                j = 0; \
                do \
                { \
                    if (*state->value.valuesI == glEffect->shader_indices[j]) \
                    { \
                        raw = &glEffect->effect->objects[*state->value.valuesI].shader; \
                        glEffect->gls = &glEffect->shaders[j]; \
                        break; \
                    } \
                    else if (glEffect->num_preshaders > 0 \
                          && *state->value.valuesI == glEffect->preshader_indices[j]) \
                    { \
                        raw = &glEffect->effect->objects[*state->value.valuesI].shader; \
                        has_preshader = 1; \
                        break; \
                    } \
                } while (++j < glEffect->num_shaders); \
            }
        if ASSIGN_SHADER(MOJOSHADER_RS_VERTEXSHADER, rawVert, current_vert)
        else if ASSIGN_SHADER(MOJOSHADER_RS_PIXELSHADER, rawFrag, current_frag)
        #undef ASSIGN_SHADER
    } // for

    glEffect->effect->state_changes->render_state_changes = curPass->states;
    glEffect->effect->state_changes->render_state_change_count = curPass->state_count;

    glEffect->current_vert_raw = rawVert;
    glEffect->current_frag_raw = rawFrag;

    /* If this effect pass has an array of shaders, we get to wait until
     * CommitChanges to actually bind the final shaders.
     * -flibit
     */
    if (!has_preshader)
    {
        MOJOSHADER_glBindShaders(glEffect->current_vert,
                                 glEffect->current_frag);
        if (glEffect->current_vert_raw != NULL)
        {
            glEffect->effect->state_changes->vertex_sampler_state_changes = rawVert->samplers;
            glEffect->effect->state_changes->vertex_sampler_state_change_count = rawVert->sampler_count;
        } // if
        if (glEffect->current_frag_raw != NULL)
        {
            glEffect->effect->state_changes->sampler_state_changes = rawFrag->samplers;
            glEffect->effect->state_changes->sampler_state_change_count = rawFrag->sampler_count;
        } // if
    } // if

    MOJOSHADER_glEffectCommitChanges(glEffect);
}